

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

bool __thiscall
soul::heart::Parser::parseStatement(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  AdvanceClock *pAVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string name;
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  undefined1 local_f8 [8];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  CodeLocation local_b0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"let");
  if (bVar2) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    readVariableIdentifier_abi_cxx11_((string *)local_d0,this);
    findVariable((Parser *)local_108,(FunctionParseState *)this,(string *)state);
    if (local_108 != (undefined1  [8])0x0) {
      CompileMessageHelpers::createMessage<std::__cxx11::string&>
                ((CompileMessage *)local_108,(CompileMessageHelpers *)0x1,none,0x2ab445,local_d0,
                 in_R9);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,local_108);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_f0._8_8_);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,(ulong)((long)local_f8 + 1));
      }
    }
    local_108 = (undefined1  [8])0x0;
    local_100._M_p = (pointer)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_d0._0_8_,(pointer)(local_d0._8_8_ + local_d0._0_8_));
    local_f0[0x10] = true;
    local_f0[0x11] = false;
    parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_108);
    if ((SourceCodeText *)local_100._M_p != (SourceCodeText *)local_f0) {
LAB_00256b84:
      operator_delete(local_100._M_p,CONCAT71(local_f0._1_7_,local_f0[0]) + 1);
    }
  }
  else {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"write");
    if (bVar2) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      bVar2 = parseWriteStream(this,state,builder);
      return bVar2;
    }
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"advance");
    if (bVar2) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      if ((state->function->functionType).type != run) {
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,
                   "The advance() function cannot be called inside this function");
        CodeLocation::throwError
                  (&(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location,&local_68);
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2881d4);
      local_b0.sourceCode.object =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.sourceCode.object;
      if (local_b0.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_b0.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_b0.location.data =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      pAVar4 = PoolAllocator::allocate<soul::heart::AdvanceClock,soul::CodeLocation>
                         (&((builder->super_BlockBuilder).module)->allocator->pool,
                          (CodeLocation *)(local_d0 + 0x20));
      (*(builder->super_BlockBuilder)._vptr_BlockBuilder[2])(builder,pAVar4);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b0.sourceCode.object);
      return true;
    }
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"call");
    if (bVar2) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      local_108 = (undefined1  [8])0x0;
      local_f8 = (undefined1  [8])0x0;
      local_f0[0] = '\0';
      local_f0[0x10] = false;
      local_f0[0x11] = true;
      local_100._M_p = (pointer)local_f0;
      parseFunctionCall(this,state,builder,(AssignmentTarget *)local_108);
      if ((SourceCodeText *)local_100._M_p == (SourceCodeText *)local_f0) {
        return true;
      }
      local_d0._16_8_ = CONCAT71(local_f0._1_7_,local_f0[0]);
      local_d0._0_8_ = local_100._M_p;
      goto LAB_00256ba4;
    }
    bVar2 = matchesAnyIdentifier(this);
    if (!bVar2) {
      return false;
    }
    parseVariableExpression((Parser *)local_d0,(FunctionParseState *)this);
    uVar1 = local_d0._0_8_;
    if ((SourceCodeText *)local_d0._0_8_ != (SourceCodeText *)0x0) {
      cVar3 = (**(code **)(*(_func_int **)local_d0._0_8_ + 0x40))(local_d0._0_8_);
      if (cVar3 == '\0') {
        CompileMessageHelpers::createMessage<char_const(&)[2]>
                  ((CompileMessage *)(local_d0 + 0x30),(CompileMessageHelpers *)0x1,none,0x2aca29,
                   "=",(char (*) [2])in_R9);
        CodeLocation::throwError
                  (&(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location,(CompileMessage *)(local_d0 + 0x30));
      }
      local_108 = (undefined1  [8])local_d0._0_8_;
      local_f8 = (undefined1  [8])0x0;
      local_f0[0] = '\0';
      local_f0[0x10] = false;
      local_f0[0x11] = false;
      local_100._M_p = (pointer)local_f0;
      parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_108);
      if ((SourceCodeText *)local_100._M_p != (SourceCodeText *)local_f0) {
        operator_delete(local_100._M_p,CONCAT71(local_f0._1_7_,local_f0[0]) + 1);
      }
      if ((SourceCodeText *)uVar1 != (SourceCodeText *)0x0) {
        return true;
      }
    }
    readVariableIdentifier_abi_cxx11_((string *)local_d0,this);
    local_108 = (undefined1  [8])0x0;
    local_100._M_p = (pointer)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_d0._0_8_,(pointer)(local_d0._8_8_ + local_d0._0_8_));
    local_f0[0x10] = false;
    local_f0[0x11] = false;
    parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_108);
    if ((SourceCodeText *)local_100._M_p != (SourceCodeText *)local_f0) goto LAB_00256b84;
  }
  if ((SourceCodeText *)local_d0._0_8_ == (SourceCodeText *)(local_d0 + 0x10)) {
    return true;
  }
LAB_00256ba4:
  operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  return true;
}

Assistant:

bool parseStatement (FunctionParseState& state, FunctionBuilder& builder)
    {
        if (matchIf ("let"))
        {
            auto name = readVariableIdentifier();

            if (findVariable (state, name) != nullptr)
                throwError (Errors::nameInUse (name));

            parseVariableAssignment (state, builder, { nullptr, name, true, false });
            return true;
        }

        if (matchIf ("write"))
            return parseWriteStream (state, builder);

        if (matchIf ("advance"))
        {
            if (! state.function.functionType.isRun())
                location.throwError (Errors::advanceCannotBeCalledHere());

            expectSemicolon();
            builder.addAdvance (location);
            return true;
        }

        if (matchIf ("call"))
        {
            parseFunctionCall (state, builder, { nullptr, {}, false, true });
            return true;
        }

        if (matchesAnyIdentifier())
        {
            if (auto existingVariableTarget = parseVariableExpression (state))
            {
                if (! existingVariableTarget->isMutable())
                    location.throwError (Errors::operatorNeedsAssignableTarget ("="));

                parseVariableAssignment (state, builder, { existingVariableTarget, {}, false, false });
                return true;
            }

            auto newVariableName = readVariableIdentifier();
            parseVariableAssignment (state, builder, { nullptr, newVariableName, false, false });
            return true;
        }

        return false;
    }